

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake_test.c
# Opt level: O3

err_t fileMsgRead(size_t *read,void *buf,size_t count,void *file)

{
  ulong uVar1;
  err_t eVar2;
  long lVar3;
  size_t sVar4;
  
  uVar1 = *file;
  eVar2 = 0xcf;
  if (uVar1 < 4) {
    if (_msgs[uVar1].valid == 0) {
      eVar2 = 0xca;
    }
    else {
      lVar3 = *(long *)((long)file + 8);
      if (_msgs[uVar1].len < lVar3 + count) {
        sVar4 = _msgs[uVar1].len - lVar3;
        *read = sVar4;
        memCopy(buf,_msgs[uVar1].buf + lVar3,sVar4);
        lVar3 = *file;
        eVar2 = 0xffffffff;
      }
      else {
        *read = count;
        memCopy(buf,_msgs[uVar1].buf + lVar3,count);
        sVar4 = count + *(long *)((long)file + 8);
        *(size_t *)((long)file + 8) = sVar4;
        lVar3 = *file;
        eVar2 = 0;
        if (sVar4 != _msgs[lVar3].len) {
          return 0;
        }
      }
      *(long *)file = lVar3 + 1;
      *(undefined8 *)((long)file + 8) = 0;
    }
  }
  return eVar2;
}

Assistant:

static err_t fileMsgRead(size_t* read, void* buf, size_t count, void* file)
{
	file_msg_st* f;
	// pre
	ASSERT(memIsValid(file, sizeof(file_msg_st)));
	ASSERT(memIsValid(buf, count));
	ASSERT(memIsValid(read, sizeof(size_t)));
	// найти сообщение
	f = (file_msg_st*)file;
	if (f->i >= 4)
		return ERR_FILE_READ;
	if (!_msgs[f->i].valid)
		return ERR_FILE_NOT_FOUND;
	// прочитать частично?
	ASSERT(f->offset <= _msgs[f->i].len);
	if (count + f->offset > _msgs[f->i].len)
	{
		memCopy(buf, _msgs[f->i].buf + f->offset,
			*read = _msgs[f->i].len - f->offset);
		++f->i, f->offset = 0;
		return ERR_MAX;
	}
	// прочитать полностью
	memCopy(buf, _msgs[f->i].buf + f->offset, *read = count);
	f->offset += count;
	// конец сообщения?
	if (f->offset == _msgs[f->i].len)
		++f->i, f->offset = 0;
	// все нормально
	return ERR_OK;
}